

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void route_ended(tgestate_t *state,vischar_t *vischar,route_t *route)

{
  byte bVar1;
  uint8_t uVar2;
  
  if (&state->vischars[0].route == route) {
LAB_00109ef0:
    character_event(state,route);
    if (route->index != '\0') {
      get_target_assign_pos(state,vischar,route);
      return;
    }
  }
  else {
    if (vischar->character == 0) {
      bVar1 = route->index;
      if ((bVar1 & 0x7f) == 0x24) goto LAB_00109ef0;
    }
    else {
      if (0xb < vischar->character) goto LAB_00109ef0;
      bVar1 = route->index;
    }
    route->index = bVar1 + 0x80;
    if ((char)bVar1 < '\0') {
      uVar2 = route->step + '\x01';
    }
    else {
      uVar2 = route->step + 0xff;
    }
    route->step = uVar2;
  }
  return;
}

Assistant:

void route_ended(tgestate_t *state, vischar_t *vischar, route_t *route)
{
  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

#ifdef DEBUG_ROUTES
  if (vischar == &state->vischars[0])
    printf("(hero) route_ended\n");
#endif

  /* If not the hero's vischar ... */
  if (route != &state->vischars[0].route) /* Conv: was (L != 2) */
  {
    character_t character; /* was A */

    character = vischar->character; /* Conv: Removed redundant mask op. */
    assert(character != character_NONE);

    /* Call character_event at the end of commandant route 36. */
    if (character == character_0_COMMANDANT)
      if ((route->index & ~ROUTEINDEX_REVERSE_FLAG) == routeindex_36_GO_TO_SOLITARY)
        goto do_character_event;

    /* Reverse the route for guards 1..11. */
    // Guards 1..11 have fixed roles so either stand still or march back and forth along their route.
    if (character <= character_11_GUARD_11)
      goto reverse_route;
  }

do_character_event:
  /* We arrive here if:
   * - vischar is the hero, or
   * - character is character_0_COMMANDANT and route index is 36, or
   * - character is >= character_12_GUARD_12
   */

  character_event(state, route);
  if (route->index != routeindex_0_HALT) /* standing still */
    get_target_assign_pos(state, vischar, route); // re-enter
  return;

reverse_route:
  /* We arrive here if:
   * - vischar is not the hero, and
   *   - character is character_0_COMMANDANT and route index is not 36, or
   *   - character is character_1_GUARD_1 .. character_11_GUARD_11
   */

  route->index ^= ROUTEINDEX_REVERSE_FLAG; /* toggle route direction */
  // Conv: Removed [-2]+1 pattern.
  if (route->index & ROUTEINDEX_REVERSE_FLAG)
    route->step--;
  else
    route->step++;
}